

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O0

void __thiscall QRegularExpression::setPattern(QRegularExpression *this,QString *pattern)

{
  bool bVar1;
  QRegularExpressionPrivate *pQVar2;
  QString *in_RSI;
  QString *in_stack_ffffffffffffffd8;
  QString *in_stack_ffffffffffffffe0;
  
  QExplicitlySharedDataPointer<QRegularExpressionPrivate>::operator->
            ((QExplicitlySharedDataPointer<QRegularExpressionPrivate> *)0x72d801);
  bVar1 = ::operator==(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (!bVar1) {
    QExplicitlySharedDataPointer<QRegularExpressionPrivate>::detach
              ((QExplicitlySharedDataPointer<QRegularExpressionPrivate> *)in_stack_ffffffffffffffe0)
    ;
    pQVar2 = QExplicitlySharedDataPointer<QRegularExpressionPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QRegularExpressionPrivate> *)0x72d82e);
    pQVar2->isDirty = true;
    QExplicitlySharedDataPointer<QRegularExpressionPrivate>::operator->
              ((QExplicitlySharedDataPointer<QRegularExpressionPrivate> *)0x72d846);
    QString::operator=(in_RSI,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void QRegularExpression::setPattern(const QString &pattern)
{
    if (d->pattern == pattern)
        return;
    d.detach();
    d->isDirty = true;
    d->pattern = pattern;
}